

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

void Gia_ManResubTest3_(void)

{
  Gia_ResbMan_t *p;
  Vec_Ptr_t *vDivs;
  void **ppvVar1;
  undefined8 *__ptr;
  void *pvVar2;
  int iVar3;
  ulong *puVar4;
  long lVar5;
  ulong local_68;
  ulong uStack_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  word Truth;
  
  puVar4 = &local_68;
  p = Gia_ResbAlloc(1);
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0xaaaaaaaaaaaaaaaa;
  local_50 = 0xcccccccccccccccc;
  local_48 = 0xf0f0f0f0f0f0f0f0;
  local_40 = 0xff00ff00ff00ff00;
  vDivs = (Vec_Ptr_t *)malloc(0x10);
  vDivs->nSize = 0;
  ppvVar1 = (void **)malloc(0x40);
  vDivs->pArray = ppvVar1;
  __ptr = (undefined8 *)malloc(0x10);
  *__ptr = 100;
  pvVar2 = malloc(400);
  __ptr[1] = pvVar2;
  iVar3 = 8;
  lVar5 = 0;
  do {
    ppvVar1 = vDivs->pArray;
    if ((int)lVar5 == iVar3) {
      if (ppvVar1 == (void **)0x0) {
        ppvVar1 = (void **)malloc(0x80);
      }
      else {
        ppvVar1 = (void **)realloc(ppvVar1,0x80);
      }
      vDivs->pArray = ppvVar1;
      iVar3 = 0x10;
    }
    ppvVar1[lVar5] = puVar4;
    lVar5 = lVar5 + 1;
    puVar4 = (ulong *)((long)puVar4 + 8);
  } while (lVar5 != 6);
  vDivs->nSize = 6;
  vDivs->nCap = iVar3;
  uStack_60 = (local_50 | local_58) & local_48 & local_40;
  local_68 = ~uStack_60;
  Truth = uStack_60;
  Extra_PrintHex(_stdout,(uint *)&Truth,6);
  putchar(0x20);
  Dau_DsdPrintFromTruth2(&Truth,6);
  printf("       ");
  Gia_ManResubPerform(p,vDivs,1,100,0,0x32,1,1,0);
  Gia_ResbFree(p);
  if ((void *)__ptr[1] != (void *)0x0) {
    free((void *)__ptr[1]);
  }
  free(__ptr);
  if (vDivs->pArray != (void **)0x0) {
    free(vDivs->pArray);
  }
  free(vDivs);
  return;
}

Assistant:

void Gia_ManResubTest3_()
{
    Gia_ResbMan_t * p = Gia_ResbAlloc( 1 );
    word Divs[6] = { 0, 0, 
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00) 
    };
    Vec_Ptr_t * vDivs = Vec_PtrAlloc( 6 );
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    int i; 
    for ( i = 0; i < 6; i++ )
        Vec_PtrPush( vDivs, Divs+i );

    {
        word Truth = (Divs[2] | Divs[3]) & (Divs[4] & Divs[5]);
//        word Truth = (~Divs[2] | Divs[3]) | ~Divs[4];
        Divs[0] = ~Truth;
        Divs[1] =  Truth;
        Extra_PrintHex( stdout, (unsigned*)&Truth, 6 );
        printf( " " );
        Dau_DsdPrintFromTruth2( &Truth, 6 );
        printf( "       " );
        Gia_ManResubPerform( p, vDivs, 1, 100, 0, 50, 1, 1, 0 );
    }
    Gia_ResbFree( p );
    Vec_IntFree( vRes );
    Vec_PtrFree( vDivs );
}